

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

void * hashmap_delete_with_hash(hashmap *map,void *key,uint64_t hash)

{
  ulong *__src;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong *__dest;
  ulong uVar7;
  
  map->oom = false;
  uVar5 = map->mask & hash & 0xffffffffffff;
  pvVar6 = key;
  do {
    lVar3 = map->bucketsz * uVar5;
    uVar7 = *(ulong *)((long)map->buckets + lVar3);
    if (uVar7 < 0x1000000000000) {
      bVar1 = false;
      pvVar6 = (void *)0x0;
    }
    else if ((uVar7 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
      __dest = (ulong *)((long)map->buckets + lVar3);
      if (map->compare != (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        iVar2 = (*map->compare)(key,__dest + 1,map->udata);
        if (iVar2 != 0) goto LAB_0010c35b;
      }
      memcpy(map->spare,__dest + 1,map->elsize);
      *__dest = *__dest & 0xffffffffffff;
      do {
        uVar5 = uVar5 + 1 & map->mask;
        lVar3 = map->bucketsz * uVar5;
        __src = (ulong *)((long)map->buckets + lVar3);
        uVar7 = *(ulong *)((long)map->buckets + lVar3) >> 0x31;
        if (uVar7 == 0) {
          uVar4 = *__dest & 0xffffffffffff;
        }
        else {
          memcpy(__dest,__src,map->bucketsz);
          uVar4 = *__dest & 0xffffffffffff | (*__dest & 0xffff000000000000) - 0x1000000000000;
        }
        *__dest = uVar4;
        __dest = __src;
      } while (uVar7 != 0);
      uVar7 = map->count - 1;
      map->count = uVar7;
      if ((map->cap < map->nbuckets) && (uVar7 <= map->shrinkat)) {
        resize(map,map->nbuckets >> 1);
      }
      pvVar6 = map->spare;
      bVar1 = false;
    }
    else {
LAB_0010c35b:
      uVar5 = uVar5 + 1 & map->mask;
      bVar1 = true;
    }
    if (!bVar1) {
      return pvVar6;
    }
  } while( true );
}

Assistant:

const void *hashmap_delete_with_hash(struct hashmap *map, const void *key,
    uint64_t hash)
{
    hash = clip_hash(hash);
    map->oom = false;
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) {
            return NULL;
        }
        void *bitem = bucket_item(bucket);
        if (bucket->hash == hash && (!map->compare ||
            map->compare(key, bitem, map->udata) == 0))
        {
            memcpy(map->spare, bitem, map->elsize);
            bucket->dib = 0;
            while(1) {
                struct bucket *prev = bucket;
                i = (i + 1) & map->mask;
                bucket = bucket_at(map, i);
                if (bucket->dib <= 1) {
                    prev->dib = 0;
                    break;
                }
                memcpy(prev, bucket, map->bucketsz);
                prev->dib--;
            }
            map->count--;
            if (map->nbuckets > map->cap && map->count <= map->shrinkat) {
                // Ignore the return value. It's ok for the resize operation to
                // fail to allocate enough memory because a shrink operation
                // does not change the integrity of the data.
                resize(map, map->nbuckets/2);
            }
            return map->spare;
        }
        i = (i + 1) & map->mask;
    }
}